

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

string * __thiscall
tonk::ErrorResult::ToJson_abi_cxx11_(string *__return_storage_ptr__,ErrorResult *this)

{
  ostream *poVar1;
  tonk *ptVar2;
  char *value;
  string *value_00;
  char *value_01;
  char *value_02;
  ostringstream oss;
  string local_1d0;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"{ \"source\": ");
  JsonValue<char_const*>(&local_1d0,(tonk *)this->Source,value);
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar1 = std::operator<<((ostream *)local_190,", \"description\": ");
  std::__cxx11::string::string(local_1b0,(string *)&this->Description);
  JsonValue<std::__cxx11::string>(&local_1d0,(tonk *)local_1b0,value_00);
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string(local_1b0);
  poVar1 = std::operator<<((ostream *)local_190,", \"error_type\": ");
  ptVar2 = (tonk *)ErrorTypeToString(this->Type);
  JsonValue<char_const*>(&local_1d0,ptVar2,value_01);
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (this->Type == Tonk) {
    poVar1 = std::operator<<((ostream *)local_190,", \"error_code\": ");
    ptVar2 = (tonk *)tonk_result_to_string((TonkResult)this->Code);
    JsonValue<char_const*>(&local_1d0,ptVar2,value_02);
    std::operator<<(poVar1,(string *)&local_1d0);
  }
  else {
    poVar1 = std::operator<<((ostream *)local_190,", \"error_code\": ");
    std::__cxx11::to_string(&local_1d0,this->Code);
    std::operator<<(poVar1,(string *)&local_1d0);
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator<<((ostream *)local_190," }");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ErrorResult::ToJson() const
{
    std::ostringstream oss;
    oss << "{ \"source\": " << JsonValue(Source);
    oss << ", \"description\": " << JsonValue(Description);
    oss << ", \"error_type\": " << JsonValue(ErrorTypeToString(Type));
    if (Type == ErrorType::Tonk)
        oss << ", \"error_code\": " << JsonValue(tonk_result_to_string((TonkResult)Code));
    else
        oss << ", \"error_code\": " << JsonValue(Code);
    oss << " }";
    return oss.str();
}